

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afk.cc
# Opt level: O2

void __thiscall AfkProcessor::flow_line(AfkProcessor *this,Params *args)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&this->currentLine_);
  flow::Params::setResult(args,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void AfkProcessor::flow_line(flow::Params& args) {
  args.setResult(currentLine_);
}